

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

_STACK * sk_new(cmp *cmp)

{
  int __errnum;
  NetSocket *sock;
  char *pcVar1;
  byte in_CL;
  byte in_DL;
  int in_ESI;
  byte in_R8B;
  byte in_R9B;
  Plug *in_stack_00000008;
  _Bool local_35;
  int err;
  NetSocket *ret;
  _Bool keepalive_local;
  _Bool nodelay_local;
  _Bool oobinline_local;
  _Bool privport_local;
  int port_local;
  SockAddr *addr_local;
  
  sock = (NetSocket *)safemalloc(1,0x98,0);
  (sock->sock).vt = &NetSocket_sockvt;
  sock->error = (char *)0x0;
  sock->plug = in_stack_00000008;
  bufchain_init(&sock->output_data);
  sock->connected = false;
  sock->writable = false;
  sock->sending_oob = 0;
  sock->frozen = false;
  sock->localhost_only = false;
  sock->pending_error = 0;
  sock->child = (NetSocket *)0x0;
  sock->parent = (NetSocket *)0x0;
  sock->oobpending = false;
  sock->outgoingeof = EOF_NO;
  sock->incomingeof = false;
  sock->listener = false;
  sock->addr = (SockAddr *)cmp;
  (sock->step).ai = sock->addr->ais;
  (sock->step).curraddr = 0;
  sock->s = -1;
  sock->oobinline = (_Bool)(in_CL & 1);
  sock->nodelay = (_Bool)(in_R8B & 1);
  sock->keepalive = (_Bool)(in_R9B & 1);
  sock->privport = (_Bool)(in_DL & 1);
  sock->port = in_ESI;
  do {
    __errnum = try_connect(sock);
    local_35 = false;
    if (__errnum != 0) {
      local_35 = sk_nextaddr(sock->addr,&sock->step);
    }
  } while (local_35 != false);
  if (__errnum != 0) {
    pcVar1 = strerror(__errnum);
    sock->error = pcVar1;
  }
  return (_STACK *)&sock->sock;
}

Assistant:

Socket *sk_new(SockAddr *addr, int port, bool privport, bool oobinline,
               bool nodelay, bool keepalive, Plug *plug)
{
    NetSocket *ret;
    int err;

    /*
     * Create NetSocket structure.
     */
    ret = snew(NetSocket);
    ret->sock.vt = &NetSocket_sockvt;
    ret->error = NULL;
    ret->plug = plug;
    bufchain_init(&ret->output_data);
    ret->connected = false;            /* to start with */
    ret->writable = false;             /* to start with */
    ret->sending_oob = 0;
    ret->frozen = false;
    ret->localhost_only = false;    /* unused, but best init anyway */
    ret->pending_error = 0;
    ret->parent = ret->child = NULL;
    ret->oobpending = false;
    ret->outgoingeof = EOF_NO;
    ret->incomingeof = false;
    ret->listener = false;
    ret->addr = addr;
    START_STEP(ret->addr, ret->step);
    ret->s = -1;
    ret->oobinline = oobinline;
    ret->nodelay = nodelay;
    ret->keepalive = keepalive;
    ret->privport = privport;
    ret->port = port;

    do {
        err = try_connect(ret);
    } while (err && sk_nextaddr(ret->addr, &ret->step));

    if (err)
        ret->error = strerror(err);

    return &ret->sock;
}